

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOWrite(char *filename,char *protocol,FmsDataCollection dc)

{
  FmsFieldDescriptor fd;
  FmsField field;
  FmsDomain domain;
  bool bVar1;
  FmsDomain *comp;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  FmsMetaData pFVar8;
  FmsInt FVar9;
  ulong uVar10;
  long lVar11;
  FmsBasisType basis_type;
  FmsFieldType field_type;
  char *fdname;
  char *local_200;
  FmsComponent fc;
  FmsScalarType dt;
  FmsInt ndoms;
  char *fc_name;
  FmsFieldDescriptorType fd_type;
  FmsIOContext ctx;
  FmsDomain *doms;
  FmsMetaData local_198;
  char *local_190;
  FmsIntType idtype;
  FmsMesh local_180;
  FmsInt fo [3];
  char *fd_name;
  FmsInt local_150 [2];
  char *local_140;
  ulong local_138;
  FmsInt num_fields;
  FmsInt num_fds;
  char *local_120;
  char *local_118;
  FmsMetaData md;
  FmsFieldDescriptor *fds;
  FmsInt ntags;
  FmsInt ncomps;
  FmsInt ndnames;
  char tmp [20];
  char *name;
  FmsField *fields;
  FmsMesh mesh;
  FmsIOFunctions io;
  
  if (filename == (char *)0x0) {
    return 1;
  }
  if (dc == (FmsDataCollection)0x0) {
    return 3;
  }
  FmsIOContextInitialize(&ctx);
  io.open = FmsIOOpen;
  io.close = FmsIOClose;
  io.add_int = FmsIOAddInt;
  io.add_int_array = FmsIOAddIntArray;
  io.add_typed_int_array = FmsIOAddTypedIntArray;
  io.add_float = FmsIOAddFloat;
  io.add_double = FmsIOAddDouble;
  io.add_scalar_array = FmsIOAddScalarArray;
  io.add_string = FmsIOAddString;
  io.has_path = FmsIOHasPath;
  io.get_int = FmsIOGetInt;
  io.get_typed_int_array = FmsIOGetTypedIntArray;
  io.get_scalar_array = FmsIOGetScalarArray;
  io.get_string = FmsIOGetString;
  iVar2 = FmsIOOpen(&ctx,filename,"wt");
  if (iVar2 != 0) {
    return 5;
  }
  iVar2 = FmsIOAddInt(&ctx,"FMS",100);
  if (iVar2 != 0) {
    iVar2 = 6;
    goto LAB_0010b27f;
  }
  fds = (FmsFieldDescriptor *)0x0;
  num_fds = 0;
  num_fields = 0;
  name = (char *)0x0;
  iVar2 = FmsDataCollectionGetName(dc,&name);
  if (iVar2 == 0) {
    pcVar4 = join_keys("DataCollection","Name");
    iVar2 = FmsIOAddString(&ctx,pcVar4,name);
    free(pcVar4);
    if (iVar2 == 0) goto LAB_0010ab67;
  }
  else {
LAB_0010ab67:
    iVar2 = FmsDataCollectionGetFieldDescriptors(dc,&fds,&num_fds);
    if (iVar2 == 0) {
      pcVar4 = join_keys("DataCollection","NumberOfFieldDescriptors");
      iVar2 = FmsIOAddInt(&ctx,pcVar4,num_fds);
      free(pcVar4);
      if (iVar2 == 0) {
        pcVar4 = join_keys("DataCollection","FieldDescriptors");
        uVar10 = 0;
        iVar2 = 0;
        while ((uVar10 < num_fds && (iVar2 == 0))) {
          sprintf(tmp,"%d",uVar10 & 0xffffffff);
          pcVar5 = join_keys(pcVar4,tmp);
          fd = fds[uVar10];
          fd_name = (char *)0x0;
          iVar3 = FmsFieldDescriptorGetName(fd,&fd_name);
          iVar2 = 1;
          if (iVar3 == 0) {
            pcVar6 = join_keys(pcVar5,"Name");
            FmsIOAddString(&ctx,pcVar6,fd_name);
            free(pcVar6);
            fc = (FmsComponent)0x0;
            iVar3 = FmsFieldDescriptorGetComponent(fd,&fc);
            iVar2 = 2;
            if ((iVar3 == 0) && (iVar2 = 3, fc != (FmsComponent)0x0)) {
              fc_name = (char *)0x0;
              iVar3 = FmsComponentGetName(fc,&fc_name);
              iVar2 = 4;
              if (iVar3 == 0) {
                pcVar6 = join_keys(pcVar5,"ComponentName");
                FmsIOAddString(&ctx,pcVar6,fc_name);
                free(pcVar6);
                iVar3 = FmsFieldDescriptorGetType(fd,&fd_type);
                iVar2 = 5;
                if (iVar3 == 0) {
                  pcVar6 = join_keys(pcVar5,"Type");
                  FmsIOAddInt(&ctx,pcVar6,(long)(int)fd_type);
                  free(pcVar6);
                  iVar3 = FmsFieldDescriptorGetFixedOrder(fd,&field_type,&basis_type,fo + 2);
                  iVar2 = 6;
                  if (iVar3 == 0) {
                    fo[0] = (ulong)_field_type & 0xffffffff;
                    fo[1] = (ulong)_basis_type & 0xffffffff;
                    pcVar6 = join_keys(pcVar5,"FixedOrder");
                    FmsIOAddIntArray(&ctx,pcVar6,fo,3);
                    free(pcVar6);
                    fdname = (char *)0x0;
                    iVar3 = FmsFieldDescriptorGetNumDofs(fd,(FmsInt *)&fdname);
                    iVar2 = 7;
                    if (iVar3 == 0) {
                      pcVar6 = join_keys(pcVar5,"NumDofs");
                      FmsIOAddInt(&ctx,pcVar6,(FmsInt)fdname);
                      free(pcVar6);
                      iVar2 = 0;
                    }
                  }
                }
              }
            }
          }
          free(pcVar5);
          uVar10 = uVar10 + 1;
        }
        free(pcVar4);
        if ((iVar2 == 0) && (iVar2 = FmsDataCollectionGetFields(dc,&fields,&num_fields), iVar2 == 0)
           ) {
          pcVar4 = join_keys("DataCollection","NumberOfFields");
          iVar2 = FmsIOAddInt(&ctx,pcVar4,num_fields);
          free(pcVar4);
          if (iVar2 == 0) {
            pcVar4 = join_keys("DataCollection","Fields");
            iVar2 = 0;
            local_200 = pcVar4;
            for (uVar10 = 0; (iVar2 == 0 && (uVar10 < num_fields)); uVar10 = uVar10 + 1) {
              sprintf((char *)fo,"%d",uVar10 & 0xffffffff);
              pcVar5 = join_keys(pcVar4,(char *)fo);
              field = fields[uVar10];
              iVar3 = FmsFieldGetName(field,(char **)tmp);
              iVar2 = 1;
              if (iVar3 == 0) {
                pcVar6 = join_keys(pcVar5,"Name");
                FmsIOAddString(&ctx,pcVar6,(char *)tmp._0_8_);
                free(pcVar6);
                fd_name = (char *)0x0;
                fc = (FmsComponent)0x0;
                iVar3 = FmsFieldGet(field,(FmsFieldDescriptor *)&fd_name,(FmsInt *)&fc,&basis_type,
                                    &dt,&fc_name);
                iVar2 = 2;
                if (iVar3 == 0) {
                  pcVar4 = join_keys(pcVar5,"LayoutType");
                  FmsIOAddInt(&ctx,pcVar4,(ulong)_basis_type & 0xffffffff);
                  free(pcVar4);
                  pcVar6 = join_keys(pcVar5,"NumberOfVectorComponents");
                  pcVar4 = local_200;
                  FmsIOAddInt(&ctx,pcVar6,(FmsInt)fc);
                  free(pcVar6);
                  iVar2 = 3;
                  if (fd_name != (char *)0x0) {
                    fdname = (char *)0x0;
                    iVar3 = FmsFieldDescriptorGetName((FmsFieldDescriptor)fd_name,&fdname);
                    iVar2 = 4;
                    if (iVar3 == 0) {
                      pcVar4 = join_keys(pcVar5,"FieldDescriptorName");
                      FmsIOAddString(&ctx,pcVar4,fdname);
                      free(pcVar4);
                      _fd_type = (FmsField)0x0;
                      FmsFieldDescriptorGetNumDofs((FmsFieldDescriptor)fd_name,(FmsInt *)&fd_type);
                      pcVar4 = join_keys(pcVar5,"Data");
                      FmsIOAddScalarArray(&ctx,pcVar4,dt,fc_name,(long)_fd_type * (long)fc);
                      free(pcVar4);
                      iVar3 = FmsFieldGetMetaData(field,(FmsMetaData *)&field_type);
                      iVar2 = 5;
                      pcVar4 = local_200;
                      if ((iVar3 == 0) && (iVar2 = 0, _field_type != (FmsMetaData)0x0)) {
                        pcVar4 = join_keys(pcVar5,"MetaData");
                        FmsIOWriteFmsMetaData(&ctx,&io,pcVar4,_field_type);
                        free(pcVar4);
                        pcVar4 = local_200;
                      }
                    }
                  }
                }
              }
              free(pcVar5);
            }
            free(pcVar4);
            if ((iVar2 == 0) && (iVar2 = FmsDataCollectionGetMesh(dc,&mesh), iVar2 == 0)) {
              pcVar4 = join_keys("DataCollection","Mesh");
              local_180 = mesh;
              iVar2 = FmsMeshGetPartitionId(mesh,(FmsInt *)&fd_name,local_150);
              if (iVar2 == 0) {
                pcVar5 = join_keys(pcVar4,"PartitionInfo");
                FmsIOAddIntArray(&ctx,pcVar5,(FmsInt *)&fd_name,2);
                free(pcVar5);
                ndnames = 0;
                iVar2 = FmsMeshGetNumDomainNames(local_180,&ndnames);
                if (iVar2 == 0) {
                  pcVar5 = join_keys(pcVar4,"NumDomainNames");
                  FmsIOAddInt(&ctx,pcVar5,ndnames);
                  free(pcVar5);
                  ncomps = 0;
                  iVar2 = FmsMeshGetNumComponents(local_180,&ncomps);
                  if (iVar2 == 0) {
                    pcVar5 = join_keys(pcVar4,"NumComponents");
                    FmsIOAddInt(&ctx,pcVar5,ncomps);
                    free(pcVar5);
                    ntags = 0;
                    iVar2 = FmsMeshGetNumTags(local_180,&ntags);
                    if (iVar2 == 0) {
                      pcVar5 = join_keys(pcVar4,"NumTags");
                      FmsIOAddInt(&ctx,pcVar5,ntags);
                      free(pcVar5);
                      local_120 = join_keys(pcVar4,"DomainNames");
                      for (local_138 = 0; uVar10 = local_138, local_138 < ndnames;
                          local_138 = local_138 + 1) {
                        sprintf(tmp,"%d",local_138 & 0xffffffff);
                        local_118 = join_keys(local_120,tmp);
                        _dt = (char **)0x0;
                        ndoms = 0;
                        doms = (FmsDomain *)0x0;
                        iVar2 = FmsMeshGetDomains(local_180,uVar10,(char **)&dt,&ndoms,&doms);
                        pcVar5 = local_118;
                        if ((iVar2 == 0) && (_dt != (char **)0x0)) {
                          pcVar6 = join_keys(local_118,"Name");
                          FmsIOAddString(&ctx,pcVar6,(char *)_dt);
                          free(pcVar6);
                          pcVar6 = join_keys(pcVar5,"NumDomains");
                          FmsIOAddInt(&ctx,pcVar6,ndoms);
                          free(pcVar6);
                          pcVar6 = join_keys(pcVar5,"Domains");
                          for (pcVar5 = (char *)0x0; pcVar5 < ndoms; pcVar5 = pcVar5 + 1) {
                            sprintf((char *)fo,"%d",(ulong)pcVar5 & 0xffffffff);
                            pcVar7 = join_keys(pcVar6,(char *)fo);
                            domain = doms[(long)pcVar5];
                            fc = (FmsComponent)0x0;
                            iVar2 = FmsDomainGetDimension(domain,(FmsInt *)&fc);
                            if (iVar2 == 0) {
                              local_140 = pcVar5;
                              pcVar5 = join_keys(pcVar7,"Dimension");
                              FmsIOAddInt(&ctx,pcVar5,(FmsInt)fc);
                              free(pcVar5);
                              fc_name = (char *)0x0;
                              iVar2 = FmsDomainGetNumVertices(domain,(FmsInt *)&fc_name);
                              pcVar5 = local_140;
                              if (iVar2 == 0) {
                                pcVar5 = join_keys(pcVar7,"NumVertices");
                                FmsIOAddInt(&ctx,pcVar5,(FmsInt)fc_name);
                                free(pcVar5);
                                local_198 = (FmsMetaData)join_keys(pcVar7,"Entities");
                                uVar10 = 0;
                                for (lVar11 = 1; pFVar8 = local_198, lVar11 != 8;
                                    lVar11 = lVar11 + 1) {
                                  fdname = (char *)0x0;
                                  FmsDomainGetNumEntities
                                            (domain,(FmsEntityType)lVar11,(FmsInt *)&fdname);
                                  if (fdname != (char *)0x0) {
                                    local_190 = (char *)CONCAT44(local_190._4_4_,(int)uVar10);
                                    sprintf((char *)&fd_type,"%d",uVar10);
                                    pFVar8 = (FmsMetaData)
                                             join_keys((char *)local_198,(char *)&fd_type);
                                    local_200 = FmsEntityTypeNames[lVar11];
                                    pcVar5 = join_keys((char *)pFVar8,"EntityType");
                                    FmsIOAddString(&ctx,pcVar5,local_200);
                                    free(pcVar5);
                                    pcVar5 = join_keys((char *)pFVar8,"NumEntities");
                                    FmsIOAddInt(&ctx,pcVar5,(FmsInt)fdname);
                                    free(pcVar5);
                                    _field_type = (FmsMetaData)0x0;
                                    _basis_type = (FmsDomain)0x0;
                                    iVar2 = FmsDomainGetAllEntities
                                                      (domain,(FmsEntityType)lVar11,&idtype,
                                                       (void **)&field_type,(FmsInt *)&basis_type);
                                    if (((iVar2 != 0) || (_field_type == (FmsMetaData)0x0)) ||
                                       ((FmsDomain)fdname != _basis_type)) break;
                                    uVar10 = (ulong)((int)local_190 + 1);
                                    FmsIOAddTypedIntArray
                                              (&ctx,(char *)pFVar8,idtype,_field_type,
                                               (long)fdname * FmsEntityNumSides[lVar11]);
                                    free(pFVar8);
                                  }
                                }
                                free(pFVar8);
                                pcVar5 = local_140;
                              }
                            }
                            free(pcVar7);
                          }
                          free(pcVar6);
                        }
                        free(local_118);
                      }
                      free(local_120);
                      local_190 = join_keys(pcVar4,"Components");
                      for (uVar10 = 0; uVar10 < ncomps; uVar10 = uVar10 + 1) {
                        iVar2 = FmsMeshGetComponent(local_180,uVar10,(FmsComponent *)&doms);
                        if ((iVar2 != 0) || (doms == (FmsDomain *)0x0)) goto LAB_0010b273;
                        sprintf(tmp,"%d",uVar10 & 0xffffffff);
                        local_200 = join_keys(local_190,tmp);
                        comp = doms;
                        fc = (FmsComponent)0x0;
                        iVar2 = FmsComponentGetName((FmsComponent)doms,(char **)&fc);
                        if (iVar2 == 0) {
                          pcVar5 = join_keys(local_200,"Name");
                          FmsIOAddString(&ctx,pcVar5,(char *)fc);
                          free(pcVar5);
                          fc_name = (char *)0x0;
                          iVar2 = FmsComponentGetDimension((FmsComponent)comp,(FmsInt *)&fc_name);
                          if (iVar2 == 0) {
                            pcVar5 = join_keys(local_200,"Dimension");
                            FmsIOAddInt(&ctx,pcVar5,(FmsInt)fc_name);
                            free(pcVar5);
                            fdname = (char *)0x0;
                            iVar2 = FmsComponentGetNumEntities((FmsComponent)comp,(FmsInt *)&fdname)
                            ;
                            if (iVar2 == 0) {
                              pcVar5 = join_keys(local_200,"NumEntities");
                              FmsIOAddInt(&ctx,pcVar5,(FmsInt)fdname);
                              free(pcVar5);
                              _fd_type = (FmsField)0x0;
                              iVar2 = FmsComponentGetCoordinates
                                                ((FmsComponent)comp,(FmsField *)&fd_type);
                              if (iVar2 == 0) {
                                if (_fd_type != (FmsField)0x0) {
                                  fo[0] = 0;
                                  FmsFieldGetName(_fd_type,(char **)fo);
                                  pcVar5 = join_keys(local_200,"Coordinates");
                                  FmsIOAddString(&ctx,pcVar5,(char *)fo[0]);
                                  free(pcVar5);
                                }
                                _field_type = (FmsMetaData)0x0;
                                iVar2 = FmsComponentGetNumParts
                                                  ((FmsComponent)comp,(FmsInt *)&field_type);
                                pcVar5 = local_200;
                                if (iVar2 == 0) {
                                  pcVar6 = join_keys(local_200,"NumParts");
                                  FmsIOAddInt(&ctx,pcVar6,(FmsInt)_field_type);
                                  free(pcVar6);
                                  local_140 = join_keys(pcVar5,"Parts");
                                  for (local_198 = (FmsMetaData)0x0; pFVar8 = local_198,
                                      local_198 < _field_type;
                                      local_198 = (FmsMetaData)((long)&local_198->md_type + 1)) {
                                    sprintf((char *)fo,"%d",(ulong)local_198 & 0xffffffff);
                                    pcVar5 = join_keys(local_140,(char *)fo);
                                    iVar2 = FmsComponentGetPart((FmsComponent)comp,(FmsInt)pFVar8,
                                                                FMS_VERTEX,(FmsDomain *)&basis_type,
                                                                (FmsIntType *)0x0,(void **)0x0,
                                                                (FmsOrientation **)0x0,(FmsInt *)0x0
                                                               );
                                    if (iVar2 != 0) goto LAB_0010b8b0;
                                    if (_basis_type != (FmsDomain)0x0) {
                                      _dt = (char **)0x0;
                                      ndoms = 0;
                                      iVar2 = FmsDomainGetName(_basis_type,(char **)&dt,&ndoms);
                                      if (iVar2 != 0) goto LAB_0010b8b0;
                                      pcVar6 = join_keys(pcVar5,"DomainName");
                                      FmsIOAddString(&ctx,pcVar6,(char *)_dt);
                                      free(pcVar6);
                                      pcVar6 = join_keys(pcVar5,"DomainID");
                                      FmsIOAddInt(&ctx,pcVar6,ndoms);
                                      free(pcVar6);
                                    }
                                    bVar1 = false;
                                    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
                                      ndoms = 0;
                                      iVar2 = FmsComponentGetPart((FmsComponent)comp,
                                                                  (FmsInt)local_198,
                                                                  (FmsEntityType)lVar11,
                                                                  (FmsDomain *)0x0,&idtype,
                                                                  (void **)&dt,
                                                                  (FmsOrientation **)0x0,&ndoms);
                                      if (iVar2 != 0) goto LAB_0010b8b0;
                                      if ((_dt != (char **)0x0) && (ndoms != 0)) {
                                        pcVar6 = FmsEntityTypeNames[lVar11];
                                        if ((char *)FmsEntityDim[lVar11] == fc_name) {
                                          pcVar7 = join_keys(pcVar5,"PartEntityType");
                                          FmsIOAddString(&ctx,pcVar7,pcVar6);
                                          free(pcVar7);
                                        }
                                        pcVar6 = join_keys(pcVar5,pcVar6);
                                        pcVar7 = join_keys(pcVar6,"NumEntities");
                                        FmsIOAddInt(&ctx,pcVar7,ndoms);
                                        free(pcVar7);
                                        FmsIOAddTypedIntArray(&ctx,pcVar6,idtype,_dt,ndoms);
                                        free(pcVar6);
                                        bVar1 = true;
                                      }
                                    }
                                    if (!bVar1) {
                                      pcVar6 = join_keys(pcVar5,"FullDomain");
                                      FmsIOAddString(&ctx,pcVar6,"Yes");
                                      free(pcVar6);
                                    }
                                    free(pcVar5);
                                  }
                                  free(local_140);
                                  fo[0] = 0;
                                  _basis_type = (FmsDomain)0x0;
                                  iVar2 = FmsComponentGetRelations
                                                    ((FmsComponent)comp,(FmsInt **)fo,
                                                     (FmsInt *)&basis_type);
                                  if (iVar2 == 0) {
                                    pcVar5 = join_keys(local_200,"Relations");
                                    FmsIOAddIntArray(&ctx,pcVar5,(FmsInt *)fo[0],(FmsInt)_basis_type
                                                    );
                                    free(pcVar5);
                                  }
                                }
                              }
                            }
                          }
                        }
LAB_0010b8b0:
                        free(local_200);
                      }
                      free(local_190);
                      local_200 = join_keys(pcVar4,"Tags");
                      for (uVar10 = 0; uVar10 < ntags; uVar10 = uVar10 + 1) {
                        iVar2 = FmsMeshGetTag(local_180,uVar10,(FmsTag *)&ndoms);
                        if (iVar2 != 0) goto LAB_0010b273;
                        sprintf(tmp,"%d",uVar10 & 0xffffffff);
                        pcVar5 = join_keys(local_200,tmp);
                        FVar9 = ndoms;
                        fc = (FmsComponent)0x0;
                        iVar2 = FmsTagGetName((FmsTag)ndoms,(char **)&fc);
                        if (iVar2 == 0) {
                          pcVar6 = join_keys(pcVar5,"TagName");
                          FmsIOAddString(&ctx,pcVar6,(char *)fc);
                          free(pcVar6);
                          iVar2 = FmsTagGetComponent((FmsTag)FVar9,(FmsComponent *)&fc_name);
                          if (iVar2 == 0) {
                            fdname = (char *)0x0;
                            iVar2 = FmsComponentGetName((FmsComponent)fc_name,&fdname);
                            if (iVar2 == 0) {
                              pcVar6 = join_keys(pcVar5,"Component");
                              FmsIOAddString(&ctx,pcVar6,fdname);
                              free(pcVar6);
                              _fd_type = (FmsField)0x0;
                              _field_type = (FmsMetaData)0x0;
                              iVar2 = FmsTagGet((FmsTag)FVar9,(FmsIntType *)&doms,(void **)&fd_type,
                                                (FmsInt *)&field_type);
                              if (iVar2 == 0) {
                                FmsIOAddTypedIntArray
                                          (&ctx,pcVar5,(FmsIntType)doms,_fd_type,(FmsInt)_field_type
                                          );
                                _basis_type = (FmsDomain)0x0;
                                _dt = (char **)0x0;
                                iVar2 = FmsTagGetDescriptions
                                                  ((FmsTag)FVar9,(FmsIntType *)0x0,
                                                   (void **)&basis_type,(char ***)&dt,
                                                   (FmsInt *)&field_type);
                                if (iVar2 == 0) {
                                  local_190 = join_keys(pcVar5,"Descriptions");
                                  pcVar6 = join_keys(local_190,"Size");
                                  FmsIOAddInt(&ctx,pcVar6,(FmsInt)_field_type);
                                  free(pcVar6);
                                  for (pFVar8 = (FmsMetaData)0x0; pFVar8 < _field_type;
                                      pFVar8 = (FmsMetaData)((long)&pFVar8->md_type + 1)) {
                                    sprintf((char *)fo,"%lu",pFVar8);
                                    pcVar6 = join_keys(local_190,(char *)fo);
                                    pcVar7 = join_keys(pcVar6,"Value");
                                    switch((ulong)doms & 0xffffffff) {
                                    case 0:
                                      FVar9 = (FmsInt)*(char *)((long)&pFVar8->md_type +
                                                               (long)_basis_type->num_entities);
                                      break;
                                    case 1:
                                      FVar9 = (FmsInt)*(short *)((long)_basis_type->num_entities +
                                                                (long)pFVar8 * 2);
                                      break;
                                    case 2:
                                      FVar9 = (FmsInt)*(int *)((long)_basis_type->num_entities +
                                                              (long)pFVar8 * 4);
                                      break;
                                    case 3:
                                    case 7:
                                      FVar9 = _basis_type->num_entities[(long)pFVar8];
                                      break;
                                    case 4:
                                      FVar9 = (FmsInt)*(byte *)((long)&pFVar8->md_type +
                                                               (long)_basis_type->num_entities);
                                      break;
                                    case 5:
                                      FVar9 = (FmsInt)*(ushort *)
                                                       ((long)_basis_type->num_entities +
                                                       (long)pFVar8 * 2);
                                      break;
                                    case 6:
                                      FVar9 = (FmsInt)*(uint *)((long)_basis_type->num_entities +
                                                               (long)pFVar8 * 4);
                                      break;
                                    default:
                                      goto switchD_0010be58_default;
                                    }
                                    FmsIOAddInt(&ctx,pcVar7,FVar9);
                                    free(pcVar7);
                                    pcVar7 = join_keys(pcVar6,"Description");
                                    FmsIOAddString(&ctx,pcVar7,_dt[(long)pFVar8]);
                                    free(pcVar7);
                                    free(pcVar6);
                                  }
                                  free(local_190);
                                }
                              }
                            }
                          }
                        }
switchD_0010be58_default:
                        free(pcVar5);
                      }
                      free(local_200);
                      free(pcVar4);
                      iVar2 = FmsDataCollectionGetMetaData(dc,&md);
                      if (iVar2 == 0) {
                        if (md == (FmsMetaData)0x0) {
LAB_0010bf97:
                          iVar2 = FmsIOClose(&ctx);
                          return (uint)(iVar2 != 0) << 3;
                        }
                        pcVar4 = join_keys("DataCollection","MetaData");
                        iVar2 = FmsIOWriteFmsMetaData(&ctx,&io,pcVar4,md);
                        free(pcVar4);
                        if (iVar2 == 0) goto LAB_0010bf97;
                      }
                      goto LAB_0010b27d;
                    }
                  }
                }
              }
LAB_0010b273:
              free(pcVar4);
            }
          }
        }
      }
    }
  }
LAB_0010b27d:
  iVar2 = 7;
LAB_0010b27f:
  FmsIOClose(&ctx);
  return iVar2;
}

Assistant:

int
FmsIOWrite(const char *filename, const char *protocol, FmsDataCollection dc) {
  FmsIOContext ctx;
  FmsIOFunctions io;

  if(filename == NULL) E_RETURN(1);
  if(protocol == NULL) protocol = "ascii";
  if(!dc) E_RETURN(3);

#ifdef FMS_HAVE_CONDUIT
  int isSupported = CheckProtocolSupportConduit(protocol);
  if(isSupported == 1) {
    FmsIOContextInitializeConduit(&ctx, protocol);
    FmsIOFunctionsInitializeConduit(&io);
  } else if(isSupported == 2) {
    FmsIOContextInitialize(&ctx);
    FmsIOFunctionsInitialize(&io);
  } else if(isSupported == 0) {
    // fprintf(stderr, "The protocol %s is not supported by this Conduit runtime.", protocol);
    return 2;
  } else {
    E_RETURN(4);
  }
#else
  FmsIOContextInitialize(&ctx);
  FmsIOFunctionsInitialize(&io);
#endif

  /* "open" the file. */
  if((*io.open)(&ctx, filename, "wt") == 0) {
    // FMS format version of this writer: 100 = v0.1
    const FmsInt fms_format_version = 100;
    if((*io.add_int)(&ctx, "FMS", fms_format_version) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(6);
    }

    if(FmsIOWriteFmsDataCollection(&ctx, &io, "DataCollection", dc) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(7);
    }

    if((*io.close)(&ctx) != 0)
      E_RETURN(8);
  } else {
    E_RETURN(5);
  }

  return 0;
}